

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int moveto_node(lyxp_set *set,lyd_node *cur_node,char *qname,uint16_t qname_len,int options)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  lyxp_node_type lVar5;
  ly_ctx *plVar6;
  uint32_t uVar7;
  int in_R9D;
  char *pcVar8;
  lyd_node *plVar9;
  lyxp_node_type local_54;
  lys_module *plStack_50;
  lyxp_node_type root_type;
  lyxp_node_type local_44;
  char *local_40;
  ly_ctx *local_38;
  
  uVar4 = (ulong)qname_len;
  if (set == (lyxp_set *)0x0) {
    return 0;
  }
  if (set->type == LYXP_SET_EMPTY) {
    return 0;
  }
  if (cur_node == (lyd_node *)0x0) {
    __assert_fail("cur_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                  ,0x151f,
                  "int moveto_node(struct lyxp_set *, struct lyd_node *, const char *, uint16_t, int)"
                 );
  }
  plVar6 = cur_node->schema->module->ctx;
  switch(set->type) {
  case LYXP_SET_NODE_SET:
    local_38 = plVar6;
    moveto_get_root(cur_node,options,&local_54);
    pcVar8 = strnchr(qname,0x3a,(uint)qname_len);
    plVar6 = local_38;
    if (pcVar8 == (char *)0x0) {
      if ((qname_len == 1) && (*qname == '*')) {
        plStack_50 = (lys_module *)0x0;
        uVar4 = 1;
      }
      else {
        plStack_50 = lyd_node_module(cur_node);
        plVar6 = local_38;
      }
    }
    else {
      uVar2 = (int)pcVar8 - (int)qname;
      local_40 = (char *)(ulong)uVar2;
      plStack_50 = moveto_resolve_model(qname,(uint16_t)uVar2,local_38,(lys_node *)0x0,0,in_R9D);
      if (plStack_50 == (lys_module *)0x0) {
        ly_vlog(plVar6,LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,local_40,qname);
        return -1;
      }
      qname = qname + (long)(int)(uint)local_40 + 1;
      uVar4 = (ulong)(~(uint)local_40 + (uint)qname_len);
    }
    local_40 = lydict_insert(plVar6,qname,uVar4 & 0xffff);
    if (set->used != 0) {
      uVar4 = 0;
      local_44 = local_54;
      do {
        plVar9 = (set->val).nodes[uVar4].node;
        if ((set->val).nodes[uVar4].type < LYXP_NODE_ELEM) {
          if (plVar9 == (lyd_node *)0x0) goto LAB_0017d259;
          bVar1 = false;
          do {
            uVar7 = options;
            iVar3 = moveto_node_check(plVar9,local_44,local_40,plStack_50,options);
            if (iVar3 == 0) {
              lVar5 = (lyxp_node_type)uVar4;
              if (bVar1) {
                set_insert_node(set,plVar9,0,LYXP_NODE_ELEM,lVar5);
              }
              else {
                set_replace_node(set,plVar9,2,lVar5,uVar7);
              }
              uVar4 = (ulong)(lVar5 + LYXP_NODE_ROOT_CONFIG);
              bVar1 = true;
            }
            else if (iVar3 == 1) {
LAB_0017d2de:
              lydict_remove(local_38,local_40);
              return 1;
            }
            plVar9 = plVar9->next;
          } while (plVar9 != (lyd_node *)0x0);
LAB_0017d23d:
          if (!bVar1) goto LAB_0017d259;
        }
        else {
          if (((-1 < (char)plVar9->validity) &&
              ((plVar9->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)) &&
             (plVar9 = plVar9->child, plVar9 != (lyd_node *)0x0)) {
            bVar1 = false;
            do {
              uVar7 = options;
              iVar3 = moveto_node_check(plVar9,local_44,local_40,plStack_50,options);
              if (iVar3 == 0) {
                lVar5 = (lyxp_node_type)uVar4;
                if (bVar1) {
                  set_insert_node(set,plVar9,0,LYXP_NODE_ELEM,lVar5);
                }
                else {
                  set_replace_node(set,plVar9,2,lVar5,uVar7);
                }
                uVar4 = (ulong)(lVar5 + LYXP_NODE_ROOT_CONFIG);
                bVar1 = true;
              }
              else if (iVar3 == 1) goto LAB_0017d2de;
              plVar9 = plVar9->next;
            } while (plVar9 != (lyd_node *)0x0);
            goto LAB_0017d23d;
          }
LAB_0017d259:
          set_remove_node(set,(uint32_t)uVar4);
        }
      } while ((uint)uVar4 < set->used);
    }
    lydict_remove(local_38,local_40);
    return 0;
  case LYXP_SET_SNODE_SET:
    pcVar8 = "schema node set";
    local_38 = plVar6;
    break;
  case LYXP_SET_BOOLEAN:
    pcVar8 = "boolean";
    local_38 = plVar6;
    break;
  case LYXP_SET_NUMBER:
    pcVar8 = "number";
    local_38 = plVar6;
    break;
  case LYXP_SET_STRING:
    pcVar8 = "string";
    local_38 = plVar6;
    break;
  default:
    pcVar8 = (char *)0x0;
  }
  ly_vlog(plVar6,LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar8);
  return -1;
}

Assistant:

static int
moveto_node(struct lyxp_set *set, struct lyd_node *cur_node, const char *qname, uint16_t qname_len, int options)
{
    uint32_t i;
    int replaced, pref_len, ret;
    const char *ptr, *name_dict = NULL; /* optimalization - so we can do (==) instead (!strncmp(...)) in moveto_node_check() */
    struct lys_module *moveto_mod;
    struct lyd_node *sub;
    struct ly_ctx *ctx;
    enum lyxp_node_type root_type;

    if (!set || (set->type == LYXP_SET_EMPTY)) {
        return EXIT_SUCCESS;
    }

    assert(cur_node);
    ctx = cur_node->schema->module->ctx;

    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(ctx, LYE_XPATH_INOP_1, LY_VLOG_NONE, NULL, "path operator", print_set_type(set));
        return -1;
    }

    moveto_get_root(cur_node, options, &root_type);

    /* prefix */
    if ((ptr = strnchr(qname, ':', qname_len))) {
        /* specific module */
        pref_len = ptr - qname;
        moveto_mod = moveto_resolve_model(qname, pref_len, ctx, NULL, 1, 0);
        if (!moveto_mod) {
            LOGVAL(ctx, LYE_XPATH_INMOD, LY_VLOG_NONE, NULL, pref_len, qname);
            return -1;
        }
        qname += pref_len + 1;
        qname_len -= pref_len + 1;
    } else if ((qname[0] == '*') && (qname_len == 1)) {
        /* all modules - special case */
        moveto_mod = NULL;
    } else {
        /* content node module */
        moveto_mod = lyd_node_module(cur_node);
    }

    /* name */
    name_dict = lydict_insert(ctx, qname, qname_len);

    for (i = 0; i < set->used; ) {
        replaced = 0;

        if ((set->val.nodes[i].type == LYXP_NODE_ROOT_CONFIG) || (set->val.nodes[i].type == LYXP_NODE_ROOT)) {
            LY_TREE_FOR(set->val.nodes[i].node, sub) {
                ret = moveto_node_check(sub, root_type, name_dict, moveto_mod, options);
                if (!ret) {
                    /* pos filled later */
                    if (!replaced) {
                        set_replace_node(set, sub, 0, LYXP_NODE_ELEM, i);
                        replaced = 1;
                    } else {
                        set_insert_node(set, sub, 0, LYXP_NODE_ELEM, i);
                    }
                    ++i;
                } else if (ret == EXIT_FAILURE) {
                    lydict_remove(ctx, name_dict);
                    return EXIT_FAILURE;
                }
            }

        /* skip nodes without children - leaves, leaflists, anyxmls, and dummy nodes (ouput root will eval to true) */
        } else if (!(set->val.nodes[i].node->validity & LYD_VAL_INUSE)
                && !(set->val.nodes[i].node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA))) {

            LY_TREE_FOR(set->val.nodes[i].node->child, sub) {
                ret = moveto_node_check(sub, root_type, name_dict, moveto_mod, options);
                if (!ret) {
                    if (!replaced) {
                        set_replace_node(set, sub, 0, LYXP_NODE_ELEM, i);
                        replaced = 1;
                    } else {
                        set_insert_node(set, sub, 0, LYXP_NODE_ELEM, i);
                    }
                    ++i;
                } else if (ret == EXIT_FAILURE) {
                    lydict_remove(ctx, name_dict);
                    return EXIT_FAILURE;
                }
            }
        }

        if (!replaced) {
            /* no match */
            set_remove_node(set, i);
        }
    }
    lydict_remove(ctx, name_dict);

    return EXIT_SUCCESS;
}